

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

Signal<double,_int> * __thiscall
dynamicgraph::Signal<double,_int>::operator=(Signal<double,_int> *this,double *t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  
  if (((this->keepReference == true) && (this->signalType == REFERENCE_NON_CONST)) &&
     (pdVar2 = this->TreferenceNonConst, pdVar2 != (double *)0x0)) {
    pdVar1 = &this->Tcopy1;
    bVar4 = this->Tcopy == pdVar1;
    pdVar3 = &this->Tcopy2;
    if (!bVar4) {
      pdVar3 = pdVar1;
    }
    (&this->Tcopy1)[bVar4] = *t;
    this->copyInit = true;
    this->Tcopy = pdVar3;
    *pdVar2 = *t;
  }
  else {
    (*(this->super_SignalBase<int>)._vptr_SignalBase[0x18])(this);
  }
  return this;
}

Assistant:

Signal<T, Time> &Signal<T, Time>::operator=(const T &t) {
  if (keepReference && (REFERENCE_NON_CONST == signalType) &&
      (NULL != TreferenceNonConst)) {
    if (NULL == providerMutex) {
      setTcopy(t);
      (*TreferenceNonConst) = t;
    } else {
      try {
#ifdef HAVE_LIBBOOST_THREAD
        boost::try_mutex::scoped_try_lock lock(*providerMutex);
#endif
        setTcopy(t);
        (*TreferenceNonConst) = t;
      } catch (const MutexError &) { /* TODO ERROR */
      }
    }
  } else {
    setConstant(t);
  }
  return *this;
}